

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_889438::TGlslangToSpvTraverser::collectRayTracingLinkerObjects
          (TGlslangToSpvTraverser *this)

{
  bool bVar1;
  int iVar2;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar4;
  pair<unsigned_int,_glslang::TIntermSymbol_*> pVar5;
  pair<unsigned_int,_glslang::TIntermSymbol_*> local_60;
  int local_4c;
  uint local_48;
  int set;
  TStorageQualifier st;
  uint location;
  TIntermSymbol *objNode;
  TIntermNode **objSeq;
  iterator __end1;
  iterator __begin1;
  TIntermSequence *__range1;
  TIntermAggregate *linkerObjects;
  TGlslangToSpvTraverser *this_local;
  
  pTVar3 = glslang::TIntermediate::findLinkerObjects(this->glslangIntermediate);
  iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])();
  __end1 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var,iVar2));
  objSeq = (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                     ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                      CONCAT44(extraout_var,iVar2));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                     *)&objSeq), bVar1) {
    objNode = (TIntermSymbol *)
              __gnu_cxx::
              __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
              ::operator*(&__end1);
    iVar2 = (*((TIntermNode *)(objNode->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)->
              _vptr_TIntermNode[0xc])();
    _st = (TIntermSymbol *)CONCAT44(extraout_var_00,iVar2);
    if (_st != (TIntermSymbol *)0x0) {
      iVar2 = (*(_st->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
      bVar1 = glslang::TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_01,iVar2));
      if (bVar1) {
        iVar2 = (*(_st->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        set = *(uint *)(CONCAT44(extraout_var_02,iVar2) + 0x1c) & 0xfff;
        iVar2 = (*(_st->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])();
        local_48 = *(uint *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f;
        if (local_48 - 9 < 2) {
          local_4c = 0;
        }
        else if (local_48 - 0xc < 2) {
          local_4c = 1;
        }
        else if (local_48 == 0xe) {
          local_4c = 2;
        }
        else {
          local_4c = -1;
        }
        if (local_4c != -1) {
          lVar4 = (long)local_4c;
          pVar5 = std::make_pair<unsigned_int&,glslang::TIntermSymbol*&>
                            ((uint *)&set,(TIntermSymbol **)&st);
          local_60.second = pVar5.second;
          local_60.first = pVar5.first;
          std::
          unordered_map<unsigned_int,glslang::TIntermSymbol*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>>
          ::insert<std::pair<unsigned_int,glslang::TIntermSymbol*>>
                    ((unordered_map<unsigned_int,glslang::TIntermSymbol*,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,glslang::TIntermSymbol*>>>
                      *)(this->locationToSymbol + lVar4),&local_60);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TGlslangToSpvTraverser::collectRayTracingLinkerObjects()
{
    glslang::TIntermAggregate* linkerObjects = glslangIntermediate->findLinkerObjects();
    for (auto& objSeq : linkerObjects->getSequence()) {
        auto objNode = objSeq->getAsSymbolNode();
        if (objNode != nullptr) {
            if (objNode->getQualifier().hasLocation()) {
                unsigned int location = objNode->getQualifier().layoutLocation;
                auto st = objNode->getQualifier().storage;
                int set;
                switch (st)
                {
                case glslang::EvqPayload:
                case glslang::EvqPayloadIn:
                    set = 0;
                    break;
                case glslang::EvqCallableData:
                case glslang::EvqCallableDataIn:
                    set = 1;
                    break;

                case glslang::EvqHitObjectAttrNV:
                    set = 2;
                    break;

                default:
                    set = -1;
                }
                if (set != -1)
                    locationToSymbol[set].insert(std::make_pair(location, objNode));
            }
        }
    }
}